

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O2

int __thiscall
libtorrent::aux::
bencode_visitor<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator()(bencode_visitor<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,string_type *str)

{
  int iVar1;
  int iVar2;
  
  iVar1 = write_integer<std::back_insert_iterator<std::__cxx11::string>,unsigned_long,void>
                    (this->out,str->_M_string_length);
  write_char<std::back_insert_iterator<std::__cxx11::string>>(this->out,':');
  iVar2 = write_string<std::back_insert_iterator<std::__cxx11::string>>(str,this->out);
  return iVar2 + iVar1 + 1;
}

Assistant:

int operator()(entry::string_type const& str)
		{
			int ret = write_integer(out, str.length());
			write_char(out, ':');
			ret += write_string(str, out);
			return ret + 1;
		}